

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

Arg * __thiscall
fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>::parse_arg_name
          (Arg *__return_storage_ptr__,BasicFormatter<char,_fmt::ArgFormatter<char>_> *this,Char **s
          )

{
  byte bVar1;
  Char *pCVar2;
  FormatError *this_00;
  size_t sVar3;
  size_t sVar4;
  BasicStringRef<char> arg_name;
  char *error;
  
  pCVar2 = *s;
  sVar4 = 1;
  do {
    do {
      sVar3 = sVar4;
      *s = pCVar2 + sVar3;
      bVar1 = pCVar2[sVar3];
      sVar4 = sVar3 + 1;
    } while ((byte)(bVar1 - 0x30) < 10);
  } while ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
  error = (char *)0x0;
  arg_name.size_ = sVar3;
  arg_name.data_ = pCVar2;
  get_arg(__return_storage_ptr__,this,arg_name,&error);
  if (error == (char *)0x0) {
    return __return_storage_ptr__;
  }
  this_00 = (FormatError *)__cxa_allocate_exception(0x10);
  FormatError::FormatError(this_00,(CStringRef)error);
  __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
}

Assistant:

inline internal::Arg BasicFormatter<Char, AF>::parse_arg_name(const Char *&s) {
  assert(internal::is_name_start(*s));
  const Char *start = s;
  Char c;
  do {
    c = *++s;
  } while (internal::is_name_start(c) || ('0' <= c && c <= '9'));
  const char *error = 0;
  internal::Arg arg = get_arg(BasicStringRef<Char>(start, s - start), error);
  if (error)
    FMT_THROW(FormatError(error));
  return arg;
}